

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

void ApiLayerManifestFile::CreateIfValid
               (ManifestFileType type,string *filename,
               vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
               *manifest_files)

{
  byte bVar1;
  ostream *poVar2;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_438;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0 [32];
  ostringstream local_3b0 [8];
  ostringstream error_ss;
  istream local_228 [8];
  ifstream json_stream;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  *manifest_files_local;
  string *filename_local;
  ManifestFileType type_local;
  
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"ApiLayerManifestFile::CreateIfValid ",&local_3d1);
    std::__cxx11::ostringstream::ostringstream(local_3b0,local_3d0,_S_out);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    poVar2 = std::operator<<((ostream *)local_3b0,"failed to open ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,".  Does it exist?");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"",&local_3f9);
    std::__cxx11::ostringstream::str();
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_438);
    LoaderLogger::LogErrorMessage(&local_3f8,&local_420,&local_438);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_438);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::__cxx11::ostringstream::~ostringstream(local_3b0);
  }
  else {
    CreateIfValid(type,filename,local_228,LocateLibraryRelativeToJson,manifest_files);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void ApiLayerManifestFile::CreateIfValid(ManifestFileType type, const std::string &filename,
                                         std::vector<std::unique_ptr<ApiLayerManifestFile>> &manifest_files) {
    std::ifstream json_stream(filename, std::ifstream::in);
    if (!json_stream.is_open()) {
        std::ostringstream error_ss("ApiLayerManifestFile::CreateIfValid ");
        error_ss << "failed to open " << filename << ".  Does it exist?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }
    CreateIfValid(type, filename, json_stream, &ApiLayerManifestFile::LocateLibraryRelativeToJson, manifest_files);
}